

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void api_suite::api_lower_bound(void)

{
  map_array<int,_int,_4UL,_std::less<int>_> array;
  key_type local_7c;
  iterator local_78;
  type *local_70;
  type local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  map_view<int,_int,_4UL,_std::less<int>_> local_48;
  
  local_58 = 0;
  uStack_50 = 0;
  local_68.first = 0;
  local_68.second = 0;
  uStack_60 = 0;
  local_48.super_span<vista::pair<int,_int>,_4UL>.member.head = &local_68;
  local_48.super_span<vista::pair<int,_int>,_4UL>.member.tail = (pointer)&local_48;
  local_48.member.tail = local_48.super_span<vista::pair<int,_int>,_4UL>.member.head;
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert(&local_48,(value_type)0x10000000b);
  local_7c = 10;
  local_78 = vista::map_view<int,_int,_4UL,_std::less<int>_>::lower_bound(&local_48,&local_7c);
  local_70 = local_48.super_span<vista::pair<int,_int>,_4UL>.member.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(10)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8d,"void api_suite::api_lower_bound()",&local_78,&local_70);
  local_7c = 0xb;
  local_78 = vista::map_view<int,_int,_4UL,_std::less<int>_>::lower_bound(&local_48,&local_7c);
  local_70 = local_48.super_span<vista::pair<int,_int>,_4UL>.member.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(11)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8e,"void api_suite::api_lower_bound()",&local_78,&local_70);
  local_7c = 0xc;
  local_78 = vista::map_view<int,_int,_4UL,_std::less<int>_>::lower_bound(&local_48,&local_7c);
  local_70 = local_48.member.tail;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(12)","array.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8f,"void api_suite::api_lower_bound()",&local_78,&local_70);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}